

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool CLI::detail::process_quoted_string(string *str,char string_char,char literal_char)

{
  char key;
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  string sStack_38;
  
  if (str->_M_string_length < 2) {
LAB_0017d5a4:
    bVar2 = false;
  }
  else {
    bVar2 = is_binary_escaped_string(str);
    if (bVar2) {
      extract_binary_string(&sStack_38,str);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (str,&sStack_38);
      ::std::__cxx11::string::~string((string *)&sStack_38);
    }
    else {
      pcVar1 = (str->_M_dataplus)._M_p;
      key = *pcVar1;
      if ((key == string_char) && (pcVar1[str->_M_string_length - 1] == string_char)) {
        remove_outer(str,string_char);
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(str,'\\',0);
        if (sVar3 == 0xffffffffffffffff) {
          return true;
        }
        remove_escaped_characters(&sStack_38,str);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (str,&sStack_38);
        ::std::__cxx11::string::~string((string *)&sStack_38);
        return true;
      }
      if ((key != literal_char && key != '`') || (pcVar1[str->_M_string_length - 1] != key))
      goto LAB_0017d5a4;
      remove_outer(str,key);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

CLI11_INLINE bool process_quoted_string(std::string &str, char string_char, char literal_char) {
    if(str.size() <= 1) {
        return false;
    }
    if(detail::is_binary_escaped_string(str)) {
        str = detail::extract_binary_string(str);
        return true;
    }
    if(str.front() == string_char && str.back() == string_char) {
        detail::remove_outer(str, string_char);
        if(str.find_first_of('\\') != std::string::npos) {
            str = detail::remove_escaped_characters(str);
        }
        return true;
    }
    if((str.front() == literal_char || str.front() == '`') && str.back() == str.front()) {
        detail::remove_outer(str, str.front());
        return true;
    }
    return false;
}